

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

_Bool ftp_endofresp(Curl_easy *data,connectdata *conn,char *line,size_t len,int *code)

{
  int iVar1;
  long slnum;
  int *code_local;
  size_t len_local;
  char *line_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (((((len < 4) || (*line < '0')) || ('9' < *line)) || ((line[1] < '0' || ('9' < line[1])))) ||
     ((line[2] < '0' || (('9' < line[2] || (line[3] != ' ')))))) {
    data_local._7_1_ = false;
  }
  else {
    slnum = strtol(line,(char **)0x0,10);
    iVar1 = curlx_sltosi(slnum);
    *code = iVar1;
    data_local._7_1_ = true;
  }
  return data_local._7_1_;
}

Assistant:

static bool ftp_endofresp(struct Curl_easy *data, struct connectdata *conn,
                          char *line, size_t len, int *code)
{
  (void)data;
  (void)conn;

  if((len > 3) && LASTLINE(line)) {
    *code = curlx_sltosi(strtol(line, NULL, 10));
    return TRUE;
  }

  return FALSE;
}